

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateObjectAPITableExtension
          (SwiftGenerator *this,StructDef *struct_def)

{
  FieldDef *s;
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  char *__s;
  reference pbVar3;
  bool local_8da;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_870;
  string local_868;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_848;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_840;
  iterator it_1;
  string local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  allocator<char> local_789;
  string local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  undefined1 local_410 [8];
  string code;
  value_type local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string body;
  undefined1 local_140 [8];
  string check_if_vector;
  string type;
  string field_method;
  string field_field;
  string field_var;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_90;
  const_iterator it;
  undefined1 local_80 [8];
  string builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unpack_body;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  IdlNamer::NamespacedObjectType_abi_cxx11_(&local_38,&this->namer_,&struct_def->super_Definition);
  GenerateObjectAPIExtensionHeader(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&builder.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,", &builder)",(allocator<char> *)((long)&it._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_90._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(local_18->fields).vec);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(local_18->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_830,
                 "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)",
                 (allocator<char> *)((long)&it_1._M_current + 7));
      CodeWriter::operator+=(&this->code_,&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
      local_840._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&builder.field_2 + 8));
      while( true ) {
        local_848._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&builder.field_2 + 8));
        bVar1 = __gnu_cxx::operator<(&local_840,&local_848);
        if (!bVar1) break;
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_840);
        std::__cxx11::string::string((string *)&local_868,(string *)pbVar3);
        CodeWriter::operator+=(&this->code_,&local_868);
        std::__cxx11::string::~string((string *)&local_868);
        local_870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&local_840,0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,
                 "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: __root)",&local_891
                );
      CodeWriter::operator+=(&this->code_,&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"}",&local_8b9);
      CodeWriter::operator+=(&this->code_,&local_8b8);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
      std::__cxx11::string::~string((string *)local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&builder.field_2 + 8));
      return;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_90);
    s = *ppFVar2;
    if ((s->deprecated & 1U) == 0) {
      IdlNamer::Variable_abi_cxx11_((string *)((long)&field_field.field_2 + 8),&this->namer_,s);
      IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,s);
      Namer::Method<flatbuffers::FieldDef>
                ((string *)((long)&type.field_2 + 8),&(this->namer_).super_Namer,s);
      GenType_abi_cxx11_((string *)((long)&check_if_vector.field_2 + 8),this,&(s->value).type,false)
      ;
      bVar1 = IsVector(&(s->value).type);
      local_8da = true;
      if (!bVar1) {
        local_8da = IsArray(&(s->value).type);
      }
      __s = "(";
      if (local_8da != false) {
        __s = "VectorOf(";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_140,__s,(allocator<char> *)(body.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(body.field_2._M_local_buf + 0xf));
      std::operator+(&local_1a8,"add",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      std::operator+(&local_188,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     &local_188,": ");
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      switch((s->value).type.base_type) {
      case BASE_TYPE_UTYPE:
        break;
      default:
        std::operator+(&local_810,"{{STRUCTNAME}}.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        std::operator+(&local_7f0,&local_810,"obj.");
        std::operator+(&local_7d0,&local_7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_method.field_2 + 8));
        std::operator+(&local_7b0,&local_7d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&local_810);
        break;
      case BASE_TYPE_STRING:
        std::operator+(&local_6e8,"{{STRUCTNAME}}.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        std::operator+(&local_6c8,&local_6e8,"__");
        std::operator+(&local_6a8,&local_6c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_688,&local_6a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_688);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_6e8);
        bVar1 = FieldDef::IsRequired(s);
        if (bVar1) {
          std::operator+(&local_768,"let __",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_field.field_2 + 8));
          std::operator+(&local_748,&local_768," = builder.create(string: obj.");
          std::operator+(&local_728,&local_748,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_method.field_2 + 8));
          std::operator+(&local_708,&local_728,")");
          CodeWriter::operator+=(&this->code_,&local_708);
          std::__cxx11::string::~string((string *)&local_708);
          std::__cxx11::string::~string((string *)&local_728);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::string::~string((string *)&local_768);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_788,"builder.create(string: s)",&local_789);
          BuildingOptionalObjects(this,(string *)((long)&field_method.field_2 + 8),&local_788);
          std::__cxx11::string::~string((string *)&local_788);
          std::allocator<char>::~allocator(&local_789);
        }
        break;
      case BASE_TYPE_STRUCT:
        if (((s->value).type.struct_def == (StructDef *)0x0) ||
           ((((s->value).type.struct_def)->fixed & 1U) == 0)) {
          std::operator+(&local_5e8,"let __",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_field.field_2 + 8));
          std::operator+(&local_5c8,&local_5e8," = ");
          std::operator+(&local_5a8,&local_5c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&check_if_vector.field_2 + 8));
          std::operator+(&local_588,&local_5a8,".pack(&builder, obj: &obj.");
          std::operator+(&local_568,&local_588,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_method.field_2 + 8));
          std::operator+(&local_548,&local_568,")");
          CodeWriter::operator+=(&this->code_,&local_548);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::operator+(&local_668,"{{STRUCTNAME}}.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          std::operator+(&local_648,&local_668,"__");
          std::operator+(&local_628,&local_648,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_field.field_2 + 8));
          std::operator+(&local_608,&local_628,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&builder.field_2 + 8),&local_608);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_628);
          std::__cxx11::string::~string((string *)&local_648);
          std::__cxx11::string::~string((string *)&local_668);
        }
        else {
          std::__cxx11::string::string((string *)local_410);
          struct_def_00 = (s->value).type.struct_def;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"",&local_459);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"$0",&local_481);
          GenerateStructArgs(this,struct_def_00,(string *)local_410,&local_430,&local_458,&local_480
                             ,true);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator(&local_481);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator(&local_459);
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator(&local_431);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_4a8,(ulong)local_410);
          std::__cxx11::string::operator=((string *)local_410,local_4a8);
          std::__cxx11::string::~string(local_4a8);
          std::operator+(&local_528,"{{STRUCTNAME}}.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          std::operator+(&local_508,&local_528,"obj.");
          std::operator+(&local_4e8,&local_508,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_method.field_2 + 8));
          std::operator+(&local_4c8,&local_4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&builder.field_2 + 8),&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)local_410);
        }
        break;
      case BASE_TYPE_UNION:
        std::operator+(&local_2a8,"let __",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_288,&local_2a8," = obj.");
        std::operator+(&local_268,&local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_248,&local_268,"?.pack(builder: &builder) ?? Offset()");
        CodeWriter::operator+=(&this->code_,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::operator+(&local_2e8,"if let o = obj.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_2c8,&local_2e8,"?.type {");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::operator+(&local_348,"  {{STRUCTNAME}}.add(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_328,&local_348,"Type: o");
        std::operator+(&local_308,&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::operator+(&local_3c8,"  {{STRUCTNAME}}.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        std::operator+(&local_3a8,&local_3c8,"__");
        std::operator+(&local_388,&local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_368,&local_388,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"}\n",(allocator<char> *)(code.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf));
        break;
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR:
        GenerateVectorObjectAPITableExtension(this,s);
        std::operator+(&local_228,"{{STRUCTNAME}}.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        std::operator+(&local_208,&local_228,"__");
        std::operator+(&local_1e8,&local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_field.field_2 + 8));
        std::operator+(&local_1c8,&local_1e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&builder.field_2 + 8),&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
      }
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)(check_if_vector.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

void GenerateObjectAPITableExtension(const StructDef &struct_def) {
    GenerateObjectAPIExtensionHeader(namer_.NamespacedObjectType(struct_def));
    std::vector<std::string> unpack_body;
    std::string builder = ", &builder)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto field_var = namer_.Variable(field);
      const auto field_field = namer_.Field(field);
      const auto field_method = namer_.Method(field);
      const auto type = GenType(field.value.type);
      std::string check_if_vector =
          (IsVector(field.value.type) || IsArray(field.value.type))
              ? "VectorOf("
              : "(";
      std::string body = "add" + check_if_vector + field_method + ": ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
        case BASE_TYPE_VECTOR: {
          GenerateVectorObjectAPITableExtension(field);
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          break;
        }
        case BASE_TYPE_UNION: {
          code_ += "let __" + field_var + " = obj." + field_var +
                   "?.pack(builder: &builder) ?? Offset()";
          unpack_body.push_back("if let o = obj." + field_var + "?.type {");
          unpack_body.push_back("  {{STRUCTNAME}}.add(" + field_var +
                                "Type: o" + builder);
          unpack_body.push_back("  {{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          unpack_body.push_back("}\n");
          break;
        }
        case BASE_TYPE_STRUCT: {
          if (field.value.type.struct_def &&
              field.value.type.struct_def->fixed) {
            // This is a Struct (IsStruct), not a table. We create
            // a native swift object in this case.
            std::string code;
            GenerateStructArgs(*field.value.type.struct_def, &code, "", "",
                               "$0", true);
            code = code.substr(0, code.size() - 2);
            unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                  field_field + builder);
          } else {
            code_ += "let __" + field_var + " = " + type +
                     ".pack(&builder, obj: &obj." + field_field + ")";
            unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                  builder);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          if (field.IsRequired()) {
            code_ += "let __" + field_var + " = builder.create(string: obj." +
                     field_field + ")";
          } else {
            BuildingOptionalObjects(field_field, "builder.create(string: s)");
          }
          break;
        }
        case BASE_TYPE_UTYPE: break;
        default:
          unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                field_field + builder);
      }
    }
    code_ += "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)";
    for (auto it = unpack_body.begin(); it < unpack_body.end(); it++)
      code_ += *it;
    code_ +=
        "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: "
        "__root)";
    Outdent();
    code_ += "}";
  }